

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  char *__s1;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  size_t sVar6;
  char *__s;
  ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *pVVar7;
  char *pcVar8;
  ValueGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *pVVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  csv_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  segy_files;
  CombinedSeismogramm<float,_2> s;
  char csv_file [200];
  char segy_file [200];
  option long_opt [7];
  allocator<char> local_441;
  string local_440;
  float local_41c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f8;
  char *local_3e0;
  CombinedSeismogramm<float,_2> local_3d8;
  undefined8 local_380;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  char local_2b8 [208];
  char local_1e8 [208];
  undefined1 local_118 [232];
  
  memcpy(local_2b8,"csv_file",200);
  memcpy(local_1e8,"segy_file",200);
  _opterr = 0;
  memcpy(local_118,&PTR_anon_var_dwarf_5f55_00110ba0,0xe0);
  local_3e0 = "tosegy";
  local_380 = 2;
  local_41c = 1.0;
  while( true ) {
    do {
      iVar3 = getopt_long(argc,argv,"hc:d:f:s:i:",local_118,0);
      pcVar8 = local_3e0;
      pcVar5 = _optarg;
    } while (iVar3 == 0);
    if (iVar3 < 99) break;
    switch(iVar3) {
    case 99:
      local_3e0 = _optarg;
      break;
    case 100:
      iVar3 = atoi(_optarg);
      local_380 = CONCAT44(extraout_var,iVar3);
      break;
    case 0x65:
    case 0x67:
      goto switchD_00105782_caseD_65;
    case 0x66:
      pcVar8 = local_2b8;
      goto LAB_001057e0;
    case 0x68:
      printf("Usage: %s [OPTIONS]\n",*argv);
      puts(
          "  Option                  |  Description                                       | Default "
          );
      puts(
          "  -c, --convertion          \"tosegy\" or \"tocsv\"                                  tosegy"
          );
      puts("  -d, --dims                number of dimmensions: 2 or 3                        2");
      puts(
          "  -s, --segyfile            .segy file (without _x.segy at the end)              segy_file"
          );
      puts(
          "  -f, --csvfile             .csv file (without .csv extension at the end)        csv_file"
          );
      puts("  -i, --interpolation_coef  time interpolation coefficient                       1.0");
      puts("  -h, --help                print this help and exit");
      printf("Example: %s --segyfile seismo --csvfile input\n",*argv);
      putchar(10);
      return 0;
    case 0x69:
      dVar2 = atof(_optarg);
      local_41c = (float)dVar2;
      break;
    default:
      if (iVar3 != 0x73) goto switchD_00105782_caseD_65;
      pcVar8 = local_1e8;
LAB_001057e0:
      strcpy(pcVar8,_optarg);
    }
    printf("you entered \"%s\"\n",pcVar5);
  }
  if (iVar3 == -1) {
    iVar3 = (int)local_380;
    if (iVar3 - 4U < 0xfffffffe) {
      main_cold_3();
      return -2;
    }
    iVar4 = strcmp(local_3e0,"tosegy");
    if ((iVar4 != 0) && (iVar4 = strcmp(pcVar8,"tocsv"), iVar4 != 0)) {
      main_cold_2();
      return -2;
    }
    pcVar5 = strdup(local_1e8);
    sVar6 = strlen(pcVar5);
    builtin_strncpy(pcVar5 + sVar6,"_x.segy",8);
    __s = strdup(local_1e8);
    sVar6 = strlen(__s);
    builtin_strncpy(__s + sVar6,"_y.segy",8);
    if (iVar3 != 2) {
      pcVar8 = strdup(local_1e8);
      sVar6 = strlen(pcVar8);
      builtin_strncpy(pcVar8 + sVar6,"_z.segy",8);
      local_3d8.seismogramms.
      super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3d8.seismogramms.
      super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3d8.times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3d8.seismogramms.
      super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3d8.times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3d8.times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3d8.interpolation_multiplier = local_41c;
      local_3d8.componentInfos.
      super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3d8.componentInfos.
      super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3d8.componentInfos.
      super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_440,pcVar5,(allocator<char> *)&local_418);
      pVVar9 = (ValueGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *)operator_new(8);
      pVVar9->_vptr_ValueGetter = (_func_int **)&PTR_GetValue_00110d00;
      CombinedSeismogramm<float,_3>::AddComponent
                ((CombinedSeismogramm<float,_3> *)&local_3d8,&local_440,pVVar9);
      paVar1 = &local_440.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != paVar1) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_440,__s,(allocator<char> *)&local_418);
      pVVar9 = (ValueGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *)operator_new(8);
      pVVar9->_vptr_ValueGetter = (_func_int **)&PTR_GetValue_00110d40;
      CombinedSeismogramm<float,_3>::AddComponent
                ((CombinedSeismogramm<float,_3> *)&local_3d8,&local_440,pVVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != paVar1) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_440,pcVar8,(allocator<char> *)&local_418);
      pVVar9 = (ValueGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *)operator_new(8);
      pVVar9->_vptr_ValueGetter = (_func_int **)&PTR_GetValue_00110d70;
      CombinedSeismogramm<float,_3>::AddComponent
                ((CombinedSeismogramm<float,_3> *)&local_3d8,&local_440,pVVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != paVar1) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
      local_418.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_418.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_418.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_440._M_dataplus._M_p = (pointer)paVar1;
      sVar6 = strlen(local_2b8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_440,local_2b8,local_2b8 + sVar6);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_418,
                 &local_440);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != paVar1) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
      local_3f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,pcVar5,&local_441);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3f8,
                 &local_440);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != paVar1) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,__s,&local_441);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3f8,
                 &local_440);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != paVar1) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,pcVar8,&local_441);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3f8,
                 &local_440);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != paVar1) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
      __s1 = local_3e0;
      iVar3 = strcmp(local_3e0,"tosegy");
      if (iVar3 == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_360,&local_418);
        CombinedSeismogramm<float,_3>::Load
                  ((CombinedSeismogramm<float,_3> *)&local_3d8,CSV,&local_360);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_360);
        pvVar10 = &local_300;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(pvVar10,&local_3f8);
        CombinedSeismogramm<float,_3>::Save
                  ((CombinedSeismogramm<float,_3> *)&local_3d8,SEG_Y,pvVar10);
LAB_00105f86:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(pvVar10);
      }
      else {
        iVar3 = strcmp(__s1,"tocsv");
        if (iVar3 == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_378,&local_3f8);
          CombinedSeismogramm<float,_3>::Load
                    ((CombinedSeismogramm<float,_3> *)&local_3d8,SEG_Y,&local_378);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_378);
          pvVar10 = &local_318;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(pvVar10,&local_418);
          CombinedSeismogramm<float,_3>::Save
                    ((CombinedSeismogramm<float,_3> *)&local_3d8,CSV,pvVar10);
          goto LAB_00105f86;
        }
      }
      free(pcVar5);
      free(__s);
      free(pcVar8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_418);
      std::
      vector<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
      ::~vector((vector<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
                 *)&local_3d8.componentInfos);
      goto LAB_00105fca;
    }
    local_3d8.seismogramms.
    super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3d8.seismogramms.
    super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3d8.times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3d8.seismogramms.
    super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3d8.times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3d8.times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3d8.interpolation_multiplier = local_41c;
    local_3d8.componentInfos.
    super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3d8.componentInfos.
    super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3d8.componentInfos.
    super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,pcVar5,(allocator<char> *)&local_418);
    pVVar7 = (ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *)operator_new(8);
    pVVar7->_vptr_ValueGetter = (_func_int **)&PTR_GetValue_00110c90;
    CombinedSeismogramm<float,_2>::AddComponent(&local_3d8,&local_440,pVVar7);
    paVar1 = &local_440.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != paVar1) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,__s,(allocator<char> *)&local_418);
    pVVar7 = (ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *)operator_new(8);
    pVVar7->_vptr_ValueGetter = (_func_int **)&PTR_GetValue_00110cd0;
    CombinedSeismogramm<float,_2>::AddComponent(&local_3d8,&local_440,pVVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != paVar1) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    local_418.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_418.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_418.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_440._M_dataplus._M_p = (pointer)paVar1;
    sVar6 = strlen(local_2b8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_440,local_2b8,local_2b8 + sVar6);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_418,
               &local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != paVar1) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    local_3f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,pcVar5,&local_441);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3f8,
               &local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != paVar1) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,__s,&local_441);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3f8,
               &local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != paVar1) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    iVar3 = strcmp(pcVar8,"tosegy");
    if (iVar3 == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_330,&local_418);
      CombinedSeismogramm<float,_2>::Load(&local_3d8,CSV,&local_330);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_330);
      pvVar10 = &local_2d0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(pvVar10,&local_3f8);
      CombinedSeismogramm<float,_2>::Save(&local_3d8,SEG_Y,pvVar10);
LAB_00105eeb:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(pvVar10);
    }
    else {
      iVar3 = strcmp(pcVar8,"tocsv");
      if (iVar3 == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_348,&local_3f8);
        CombinedSeismogramm<float,_2>::Load(&local_3d8,SEG_Y,&local_348);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_348);
        pvVar10 = &local_2e8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(pvVar10,&local_418);
        CombinedSeismogramm<float,_2>::Save(&local_3d8,CSV,pvVar10);
        goto LAB_00105eeb;
      }
    }
    free(pcVar5);
    free(__s);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_418);
    std::
    vector<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
    ::~vector(&local_3d8.componentInfos);
LAB_00105fca:
    std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::~vector
              (&local_3d8.seismogramms);
    if (local_3d8.times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3d8.times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3d8.times.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3d8.times.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return 0;
  }
  if ((iVar3 == 0x3a) || (iVar3 == 0x3f)) {
    main_cold_1();
    return -2;
  }
switchD_00105782_caseD_65:
  main_cold_4();
  return -2;
}

Assistant:

int main(int argc, char ** argv)
{
    char * convertion = "tosegy";
    int dims = 2;
    char csv_file[MAX_NAME_LENGTH] = "csv_file";
    char segy_file[MAX_NAME_LENGTH] = "segy_file";
    float interpolation_coef = 1.0;

    int c;
    opterr = 0;

    const char    * short_opt = "hc:d:f:s:i:";
    struct option   long_opt[] =
    {
        {"help",          no_argument,       NULL, 'h'},
        {"convertion",    required_argument, NULL, 'c'},
        {"dims",          required_argument, NULL, 'd'},
        {"csvfile",       required_argument, NULL, 'f'},
        {"segyfile",      required_argument, NULL, 's'},
        {"interpolation_coef",      required_argument, NULL, 'i'},
        {NULL,            0,                 NULL, 0  }
    };

    while((c = getopt_long(argc, argv, short_opt, long_opt, NULL)) != -1)
    {
        switch(c)
        {
            case -1:       /* no more arguments */
            case 0:        /* long options toggles */
            break;

            case 'c':
            convertion = optarg;
            printf("you entered \"%s\"\n", optarg);
            break;

            case 'd':
            dims = ::atoi(optarg);
            printf("you entered \"%s\"\n", optarg);
            break;

            case 'f':
            strcpy(csv_file, optarg);
            //csv_file = optarg;
            printf("you entered \"%s\"\n", optarg);
            break;

            case 's':
            strcpy(segy_file, optarg);
            //segy_file = optarg;
            printf("you entered \"%s\"\n", optarg);
            break;

            case 'i':
            interpolation_coef = ::atof(optarg);
            printf("you entered \"%s\"\n", optarg);
            break;

            case 'h':
            printf("Usage: %s [OPTIONS]\n", argv[0]);
            printf("  Option                  |  Description                                       | Default \n");
            printf("  -c, --convertion          \"tosegy\" or \"tocsv\"                                  tosegy\n");
            printf("  -d, --dims                number of dimmensions: 2 or 3                        2\n");
            printf("  -s, --segyfile            .segy file (without _x.segy at the end)              segy_file\n");
            printf("  -f, --csvfile             .csv file (without .csv extension at the end)        csv_file\n");
            printf("  -i, --interpolation_coef  time interpolation coefficient                       1.0\n");
            printf("  -h, --help                print this help and exit\n");
            printf("Example: %s --segyfile seismo --csvfile input\n", argv[0]);
            printf("\n");
            return(0);

            case ':':
            case '?':
            fprintf(stderr, "Try `%s --help' for more information.\n", argv[0]);
            return(-2);

            default:
            fprintf(stderr, "%s: invalid option -- %c\n", argv[0], c);
            fprintf(stderr, "Try `%s --help' for more information.\n", argv[0]);
            return(-2);
        };
    };
    if (dims != 2 && dims != 3)
    {
        fprintf(stderr, "Invalid value for option dims (should be equal to 2 or 3, but equal to %d)\n", dims);
        fprintf(stderr, "Try `%s --help' for more information.\n", argv[0]);
        return(-2);
    }
    if (strcmp(convertion,"tosegy") != 0 && strcmp(convertion,"tocsv") != 0 )
    {
        fprintf(stderr, "Invalid value for option convertion (should be equal to \"tosegy\" or \"tocsv\", but equal to %s)\n", convertion);
        fprintf(stderr, "Try `%s --help' for more information.\n", argv[0]);
        return(-2);
    }

    if (dims == 2)
    {
        char * segy_file_x = strdup(segy_file);
        strcat(segy_file_x, "_x.segy");
        char * segy_file_y = strdup(segy_file);
        strcat(segy_file_y, "_y.segy");
        typedef CombinedSeismogramm<float, 2>::Elastic SeismoElastic;
        CombinedSeismogramm < float, 2 > s = CombinedSeismogramm < float, 2 >(interpolation_coef);
        s.AddComponent(segy_file_x, new VxGetter<SeismoElastic, 2>());
        s.AddComponent(segy_file_y, new VyGetter<SeismoElastic, 2>());

        std::vector<std::string> csv_files;
        csv_files.push_back(csv_file);


        std::vector<std::string> segy_files;
        segy_files.push_back(segy_file_x);
        segy_files.push_back(segy_file_y);

        if (!strcmp(convertion,"tosegy"))
        {
            s.Load(CSV, csv_files);
            s.Save(SEG_Y, segy_files);
        }
        else if (!strcmp(convertion,"tocsv"))
        {
            s.Load(SEG_Y, segy_files);
            s.Save(CSV, csv_files);
        }
        free(segy_file_x);
        free(segy_file_y);
    }
    else if (dims == 3)
    {
        char * segy_file_x = strdup(segy_file);
        strcat(segy_file_x, "_x.segy");
        char * segy_file_y = strdup(segy_file);
        strcat(segy_file_y, "_y.segy");
        char * segy_file_z = strdup(segy_file);
        strcat(segy_file_z, "_z.segy");
        typedef CombinedSeismogramm<float, 3>::Elastic SeismoElastic;
        CombinedSeismogramm < float, 3 > s = CombinedSeismogramm < float, 3 >(interpolation_coef);
        s.AddComponent(segy_file_x, new VxGetter<SeismoElastic, 3>());
        s.AddComponent(segy_file_y, new VyGetter<SeismoElastic, 3>());
        s.AddComponent(segy_file_z, new VzGetter<SeismoElastic, 3>());

        std::vector<std::string> csv_files;
        csv_files.push_back(csv_file);


        std::vector<std::string> segy_files;
        segy_files.push_back(segy_file_x);
        segy_files.push_back(segy_file_y);
        segy_files.push_back(segy_file_z);

        if (!strcmp(convertion,"tosegy"))
        {
            s.Load(CSV, csv_files);
            s.Save(SEG_Y, segy_files);
        }
        else if (!strcmp(convertion,"tocsv"))
        {
            s.Load(SEG_Y, segy_files);
            s.Save(CSV, csv_files);
        }
        free(segy_file_x);
        free(segy_file_y);
        free(segy_file_z);
    }
    return 0;
}